

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  stringstream str;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  std::operator<<(local_180,"Square");
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==("Square",&local_1b0);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&str);
    return 0;
  }
  __assert_fail("\"Square\" == str.str()",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/polymorphism/templates.cpp"
                ,0x23,"int main()");
}

Assistant:

int main() {
  std::stringstream str{};
  auto example = config().create<App>();
  example.draw(str);
  assert("Square" == str.str());
}